

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::CryptoUtil::ComputeFastMerkleRoot
          (ByteData256 *__return_storage_ptr__,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *hashes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  ByteData256 *pBVar6;
  ByteData256 temp_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_360;
  ByteData256 inner [33];
  
  ByteData256::ByteData256(__return_storage_ptr__);
  if (*(long *)(hashes + 8) != *(long *)hashes) {
    lVar4 = 0;
    do {
      ByteData256::ByteData256
                ((ByteData256 *)
                 ((long)&inner[0].data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x318);
    uVar5 = 0;
    while( true ) {
      if ((ulong)((*(long *)(hashes + 8) - *(long *)hashes) / 0x18) <= uVar5) break;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (*(long *)hashes + uVar5 * 0x18));
      uVar2 = (uint)uVar5 + 1;
      uVar5 = (ulong)uVar2;
      pBVar6 = inner;
      for (uVar3 = 0; (uVar2 >> (uVar3 & 0x1f) & 1) == 0; uVar3 = uVar3 + 1) {
        MerkleHashSha256Midstate((ByteData256 *)&local_360,pBVar6,&temp_hash);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash,&local_360);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_360);
        pBVar6 = pBVar6 + 1;
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(inner + uVar3),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash);
    }
    uVar2 = 0xffffffff;
    __x = &local_360;
    do {
      uVar2 = uVar2 + 1;
      __x = __x + 1;
    } while (((uint)uVar5 >> (uVar2 & 0x1f) & 1) == 0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
    while( true ) {
      iVar1 = 1 << ((byte)uVar2 & 0x1f);
      if ((int)uVar5 == iVar1) break;
      uVar3 = (int)uVar5 + iVar1;
      uVar5 = (ulong)uVar3;
      pBVar6 = inner + (long)(int)uVar2 + 1;
      while (uVar2 = uVar2 + 1, (uVar3 >> (uVar2 & 0x1f) & 1) == 0) {
        MerkleHashSha256Midstate(&temp_hash,pBVar6,__return_storage_ptr__);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                   (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_hash);
        pBVar6 = pBVar6 + 1;
      }
    }
    lVar4 = 0x300;
    do {
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&inner[0].data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::ComputeFastMerkleRoot(
    const std::vector<ByteData256> &hashes) {
  static constexpr uint32_t kUintValue1 = 1;
  ByteData256 result_hash;
  if (hashes.size() == 0) return result_hash;

  // inner is an array of eagerly computed subtree hashes, indexed by tree
  // level (0 being the leaves).
  // For example, when count is 25 (11001 in binary), inner[4] is the hash of
  // the first 16 leaves, inner[3] of the next 8 leaves, and inner[0] equal to
  // the last leaf. The other inner entries are undefined.
  //
  // First process all leaves into 'inner' values.
  ByteData256 inner[33];
  uint32_t count = 0;
  int level;
  while (count < hashes.size()) {
    ByteData256 temp_hash = hashes[count];
    ++count;
    // For each of the lower bits in count that are 0, do 1 step. Each
    // corresponds to an inner value that existed before processing the
    // current leaf, and each needs a hash to combine it.
    level = 0;
    while ((count & (kUintValue1 << level)) == 0) {
      temp_hash = MerkleHashSha256Midstate(inner[level], temp_hash);
      ++level;
    }
    // Store the resulting hash at inner position level.
    inner[level] = temp_hash;
  }

  // Do a final 'sweep' over the rightmost branch of the tree to process
  // odd levels, and reduce everything to a single top value.
  // Level is the level (counted from the bottom) up to which we've sweeped.
  //
  // As long as bit number level in count is zero, skip it. It means there
  // is nothing left at this level.
  level = 0;
  while ((count & (kUintValue1 << level)) == 0) {
    ++level;
  }
  result_hash = inner[level];

  while (count != (kUintValue1 << level)) {
    // If we reach this point, hash is an inner value that is not the top.
    // We combine it with itself (Bitcoin's special rule for odd levels in
    // the tree) to produce a higher level one.

    // Increment count to the value it would have if two entries at this
    // level had existed and propagate the result upwards accordingly.
    count += (kUintValue1 << level);
    ++level;
    while ((count & (kUintValue1 << level)) == 0) {
      result_hash = MerkleHashSha256Midstate(inner[level], result_hash);
      ++level;
    }
  }
  return result_hash;
}